

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * GetFunctionTable(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  uint alignment;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  int iVar1;
  uint offset;
  int iVar2;
  VariableData **ppVVar3;
  undefined4 extraout_var;
  TypeUnsizedArray *type;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  VariableData *variable_00;
  TypeBase *pTVar4;
  InplaceStr vtableName;
  VariableData *variable;
  ExprVariableAccess *this;
  
  pTVar4 = function->type->returnType;
  if ((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0xe)) {
    __assert_fail("!isType<TypeAuto>(function->type->returnType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ba5,
                  "ExprBase *GetFunctionTable(ExpressionContext &, SynBase *, FunctionData *)");
  }
  vtableName = GetFunctionTableName(ctx,function);
  ppVVar3 = SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                      (&ctx->vtableMap,&vtableName);
  if (ppVVar3 == (VariableData **)0x0) {
    type = ExpressionContext::GetUnsizedArrayType(ctx,ctx->typeFunctionID);
    offset = anon_unknown.dwarf_94284::AllocateGlobalVariable
                       (ctx,source,(type->super_TypeStruct).super_TypeBase.alignment,
                        (type->super_TypeStruct).super_TypeBase.size);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    allocator = ctx->allocator;
    scope = ctx->globalScope;
    alignment = (type->super_TypeStruct).super_TypeBase.alignment;
    iVar2 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_01,iVar2),vtableName);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              ((VariableData *)CONCAT44(extraout_var_00,iVar1),allocator,source,scope,alignment,
               (TypeBase *)type,(SynIdentifier *)CONCAT44(extraout_var_01,iVar2),offset,uniqueId);
    variable = (VariableData *)CONCAT44(extraout_var_00,iVar1);
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->variables,&variable);
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->allVariables,&variable);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->variables,&variable);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->vtables,&variable);
    SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
              (&ctx->vtableMap,&vtableName,&variable);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    this = (ExprVariableAccess *)CONCAT44(extraout_var_02,iVar1);
    pTVar4 = variable->type;
    variable_00 = variable;
  }
  else {
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    this = (ExprVariableAccess *)CONCAT44(extraout_var,iVar1);
    pTVar4 = (*ppVVar3)->type;
    variable_00 = *ppVVar3;
  }
  ExprVariableAccess::ExprVariableAccess(this,source,pTVar4,variable_00);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* GetFunctionTable(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	assert(!isType<TypeAuto>(function->type->returnType));

	InplaceStr vtableName = GetFunctionTableName(ctx, function);

	if(VariableData **variable = ctx.vtableMap.find(vtableName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}
	
	TypeBase *type = ctx.GetUnsizedArrayType(ctx.typeFunctionID);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(vtableName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.vtables.push_back(variable);
	ctx.vtableMap.insert(vtableName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}